

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++:1049:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_xthread_test_c__:1049:17)>
             *this)

{
  __pid_t _Var1;
  Executor *pEVar2;
  anon_class_1_0_00000001 local_1f1;
  Locked<kj::Maybe<kj::Promise<int>_>_> lock;
  PredicateImpl impl;
  WaitScope waitScope;
  EventLoop loop;
  UnixEventPort port;
  
  UnixEventPort::UnixEventPort(&port);
  EventLoop::EventLoop(&loop,&port.super_EventPort);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  pEVar2 = getCurrentThreadExecutor();
  MutexGuarded<kj::Maybe<const_kj::Executor_&>_>::lockExclusive
            ((MutexGuarded<kj::Maybe<const_kj::Executor_&>_> *)&impl,(this->f).executor);
  *(Executor **)impl.condition = pEVar2;
  Locked<kj::Maybe<const_kj::Executor_&>_>::~Locked
            ((Locked<kj::Maybe<const_kj::Executor_&>_> *)&impl);
  MutexGuarded<kj::Maybe<kj::Promise<int>_>_>::lockExclusive
            ((MutexGuarded<kj::Maybe<kj::Promise<int>_>_> *)&lock,(this->f).promise);
  impl.super_Predicate._vptr_Predicate = (_func_int **)&PTR_check_005837b8;
  impl.condition = &local_1f1;
  impl.value = lock.ptr;
  kj::_::Mutex::wait(lock.mutex,&impl);
  if (((lock.ptr)->ptr).isSet != false) {
    Locked<kj::Maybe<kj::Promise<int>_>_>::~Locked(&lock);
    _Var1 = Promise<int>::wait(&((lock.ptr)->ptr).field_1.value,&waitScope);
    impl.condition = (anon_class_1_0_00000001 *)(this->f).MAGIC_VALUE;
    impl.super_Predicate._vptr_Predicate._0_4_ = _Var1;
    impl.value = (Maybe<kj::Promise<int>_> *)anon_var_dwarf_4fea7;
    if ((_Var1 != *(int *)impl.condition) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[60],kj::_::DebugComparison<int,int_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
                 ,0x428,ERROR,
                 "\"failed: expected \" \"promisePtr->wait(waitScope) == MAGIC_VALUE\", _kjCondition"
                 ,(char (*) [60])"failed: expected promisePtr->wait(waitScope) == MAGIC_VALUE",
                 (DebugComparison<int,_const_int_&> *)&impl);
    }
    WaitScope::~WaitScope(&waitScope);
    EventLoop::~EventLoop(&loop);
    UnixEventPort::~UnixEventPort(&port);
    return;
  }
  kj::_::Debug::Fault::Fault
            ((Fault *)&impl,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
             ,0x424,FAILED,"*lock != nullptr","");
  kj::_::Debug::Fault::fatal((Fault *)&impl);
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }